

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

void __thiscall
mpt::reference<mpt::layout::text>::reference
          (reference<mpt::layout::text> *this,reference<mpt::layout::text> *ref)

{
  int iVar1;
  undefined4 extraout_var;
  text *ptVar2;
  
  this->_ref = (text *)0x0;
  ptVar2 = ref->_ref;
  if (ptVar2 != (text *)0x0) {
    iVar1 = (*(ptVar2->super_metatype).super_convertable._vptr_convertable[2])(ptVar2);
    if (CONCAT44(extraout_var,iVar1) == 0) {
      ptVar2 = (text *)0x0;
    }
    if (this->_ref != (text *)0x0) {
      (*(this->_ref->super_metatype).super_convertable._vptr_convertable[1])();
    }
    this->_ref = ptVar2;
  }
  return;
}

Assistant:

inline reference(const reference &ref) : _ref(0)
	{
		*this = ref;
	}